

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<FSpecialAction,_FSpecialAction>::Reserve
          (TArray<FSpecialAction,_FSpecialAction> *this,uint amount)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint i;
  long lVar5;
  long lVar6;
  FSpecialAction *pFVar7;
  uint uVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar8 = amount + uVar1;
  this->Count = uVar8;
  auVar4 = _DAT_0073c1a0;
  auVar3 = _DAT_0073b300;
  auVar2 = _DAT_0073b2f0;
  if (uVar1 < uVar8) {
    lVar5 = (ulong)uVar8 - (ulong)uVar1;
    lVar6 = lVar5 + -1;
    auVar10._8_4_ = (int)lVar6;
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
    pFVar7 = this->Array + uVar1;
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_0073b300;
    do {
      auVar12._8_4_ = (int)uVar9;
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = (int)(uVar9 >> 0x20);
      auVar13 = (auVar12 | auVar2) ^ auVar3;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                  iVar11 < auVar13._4_4_) & 1)) {
        (pFVar7->Type).Index = 0;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        pFVar7[1].Type.Index = 0;
      }
      auVar12 = (auVar12 | auVar4) ^ auVar3;
      iVar14 = auVar12._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
        pFVar7[2].Type.Index = 0;
        pFVar7[3].Type.Index = 0;
      }
      uVar9 = uVar9 + 4;
      pFVar7 = pFVar7 + 4;
    } while ((lVar5 + 3U & 0xfffffffffffffffc) != uVar9);
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}